

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  int iVar1;
  SimpleConstructData *pSVar2;
  int iVar3;
  _Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> _Var4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  bool isConnected;
  vector<int,_std::allocator<int>_> p;
  char local_61;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  vector<double,_std::allocator<double>_> local_30;
  
  getMultiIndex<(TasGrid::RuleLocal::erule)4>(&local_60,this,x);
  MultiIndexSet::removeIndex
            (&((this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
              initial_points,(vector<int,_std::allocator<int>_> *)&local_60);
  local_61 = '\0';
  HierarchyManipulations::
  touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)4,TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)4>(double_const*,std::vector<double,std::allocator<double>>const&)::_lambda(int)_1_>
            (&local_60,&(this->super_BaseCanonicalGrid).points,(anon_class_8_1_35481f5f)&local_61);
  iVar1 = *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = 0;
  if ((1 < iVar1) && (iVar3 = 1, iVar1 != 2)) {
    uVar5 = iVar1 - 1;
    do {
      uVar5 = (int)uVar5 >> 1;
      iVar3 = iVar3 + 1;
    } while (1 < uVar5);
  }
  lVar6 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
  if (1 < lVar6) {
    lVar7 = 1;
    do {
      iVar1 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar7];
      iVar8 = 0;
      if ((1 < iVar1) && (iVar8 = 1, iVar1 != 2)) {
        uVar5 = iVar1 - 1;
        do {
          uVar5 = (int)uVar5 >> 1;
          iVar8 = iVar8 + 1;
        } while (1 < uVar5);
      }
      iVar3 = iVar3 + iVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6);
  }
  if ((local_61 == '\0') && (iVar3 != 0)) {
    pSVar2 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(vector<int,_std::allocator<int>_> *)&local_60);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_30,(vector<double,_std::allocator<double>_> *)y);
    _Var4._M_impl._M_head._M_next = (_Fwd_list_impl)operator_new(0x38);
    *(_Fwd_list_node_base *)_Var4._M_impl._M_head._M_next = (_Fwd_list_node_base)0x0;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 8))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 0x10))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 0x18))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 0x20))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 0x28))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (((_Fwd_list_impl *)((long)_Var4._M_impl._M_head._M_next + 0x30))->_M_head)._M_next =
         (_Fwd_list_node_base *)
         local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    *(_Fwd_list_node_base **)_Var4._M_impl._M_head._M_next =
         (_Fwd_list_node_base *)
         (pSVar2->data).super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>.
         _M_impl._M_head;
    (pSVar2->data).super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>.
    _M_impl = _Var4._M_impl._M_head._M_next;
  }
  else {
    expandGrid<(TasGrid::RuleLocal::erule)4>(this,&local_60,y);
    loadConstructedPoints<(TasGrid::RuleLocal::erule)4>(this);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], const std::vector<double> &y){
    auto p = getMultiIndex<effrule>(x);

    dynamic_values->initial_points.removeIndex(p);

    bool isConnected = false;
    HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points, [&](int)->void{ isConnected = true; });
    int lvl = RuleLocal::getLevel<effrule>(p[0]);
    for(int j=1; j<num_dimensions; j++) lvl += RuleLocal::getLevel<effrule>(p[j]);

    if (isConnected || (lvl == 0)){
        expandGrid<effrule>(p, y);
        loadConstructedPoints<effrule>();
    }else{
        dynamic_values->data.push_front({p, y});
    }
}